

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O2

int xz_avail(xz_statep state)

{
  int iVar1;
  uint tmp;
  
  iVar1 = -1;
  if (state->err == 0) {
    if (state->eof == 0) {
      tmp = (uint)(state->strm).avail_in;
      iVar1 = xz_load(state,state->in,state->size,&tmp);
      (state->strm).avail_in = (ulong)tmp;
      if (iVar1 == -1) {
        return -1;
      }
      (state->strm).next_in = state->in;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
xz_avail(xz_statep state)
{
    lzma_stream *strm = &(state->strm);

    if (state->err != LZMA_OK)
        return -1;
    if (state->eof == 0) {
        /* avail_in is size_t, which is not necessary sizeof(unsigned) */
        unsigned tmp = strm->avail_in;

        if (xz_load(state, state->in, state->size, &tmp) == -1) {
            strm->avail_in = tmp;
            return -1;
        }
        strm->avail_in = tmp;
        strm->next_in = state->in;
    }
    return 0;
}